

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_time.c
# Opt level: O0

void ngx_libc_gmtime(time_t s,tm *tm)

{
  tm *tm_local;
  time_t s_local;
  
  tm_local = (tm *)s;
  gmtime_r((time_t *)&tm_local,(tm *)tm);
  return;
}

Assistant:

void
ngx_libc_gmtime(time_t s, struct tm *tm)
{
#if (NGX_HAVE_LOCALTIME_R)
    (void) gmtime_r(&s, tm);

#else
    struct tm  *t;

    t = gmtime(&s);
    *tm = *t;

#endif
}